

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integration_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::BasicAuthIntegrationTest_shouldRejectRequestWithWrongPassword_Test::
TestBody::anon_class_8_1_8991fb9c::operator()(anon_class_8_1_8991fb9c *this,CURL *curl)

{
  undefined8 uVar1;
  CURL *curl_local;
  anon_class_8_1_8991fb9c *this_local;
  
  curl_easy_setopt(curl,0x6b,1);
  uVar1 = std::__cxx11::string::c_str();
  curl_easy_setopt(curl,0x27bd,uVar1);
  curl_easy_setopt(curl,0x27be,"dummy");
  return;
}

Assistant:

TEST_F(BasicAuthIntegrationTest, shouldRejectRequestWithWrongPassword) {
  fetchPrePerform_ = [&](CURL* curl) {
    curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_BASIC);
    curl_easy_setopt(curl, CURLOPT_USERNAME, username_.c_str());
    curl_easy_setopt(curl, CURLOPT_PASSWORD, "dummy");
  };

  const auto metrics = FetchMetrics(default_metrics_path_);
  ASSERT_EQ(metrics.code, 401);
}